

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioFunc.c
# Opt level: O0

int Mio_GateCollectNames(char *pFormula,char **pPinNames)

{
  int iVar1;
  char *__s;
  char *pcVar2;
  int local_30;
  int local_2c;
  int i;
  int nPins;
  char *pTemp;
  char *Buffer;
  char **pPinNames_local;
  char *pFormula_local;
  
  __s = Abc_UtilStrsav(pFormula);
  for (_i = __s; *_i != '\0'; _i = _i + 1) {
    if ((((((*_i == '*') || (*_i == '&')) || (*_i == '+')) || ((*_i == '|' || (*_i == '^')))) ||
        ((*_i == '!' || ((*_i == '\'' || (*_i == '(')))))) || (*_i == ')')) {
      *_i = ' ';
    }
  }
  local_2c = 0;
  _i = strtok(__s," ");
  while (_i != (char *)0x0) {
    local_30 = 0;
    while ((local_30 < local_2c && (iVar1 = strcmp(_i,pPinNames[local_30]), iVar1 != 0))) {
      local_30 = local_30 + 1;
    }
    if (local_30 == local_2c) {
      pcVar2 = Abc_UtilStrsav(_i);
      pPinNames[local_2c] = pcVar2;
      local_2c = local_2c + 1;
    }
    _i = strtok((char *)0x0," ");
  }
  if (__s != (char *)0x0) {
    free(__s);
  }
  return local_2c;
}

Assistant:

int Mio_GateCollectNames( char * pFormula, char * pPinNames[] )
{
    char * Buffer;
    char * pTemp;
    int nPins, i;

    // save the formula as it was
    //strcpy( Buffer, pFormula );
    Buffer = Abc_UtilStrsav( pFormula );

    // remove the non-name symbols
    for ( pTemp = Buffer; *pTemp; pTemp++ )
        if ( *pTemp == MIO_SYMB_AND  || *pTemp == MIO_SYMB_AND2   || 
             *pTemp == MIO_SYMB_OR   || *pTemp == MIO_SYMB_OR2    || 
             *pTemp == MIO_SYMB_XOR  || 
             *pTemp == MIO_SYMB_NOT  || *pTemp == MIO_SYMB_AFTNOT ||
             *pTemp == MIO_SYMB_OPEN || *pTemp == MIO_SYMB_CLOSE )
             *pTemp = ' ';

    // save the names
    nPins = 0;
    pTemp = strtok( Buffer, " " );
    while ( pTemp )
    {
        for ( i = 0; i < nPins; i++ )
            if ( strcmp( pTemp, pPinNames[i] ) == 0 )
                break;
        if ( i == nPins )
        { // cannot find this name; save it
            pPinNames[nPins++] = Abc_UtilStrsav(pTemp);
        }
        // get the next name
        pTemp = strtok( NULL, " " );
    }
    ABC_FREE( Buffer );
    return nPins;
}